

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_operators.hpp
# Opt level: O3

ParquetIntervalTargetType __thiscall
duckdb::ParquetIntervalOperator::Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
          (ParquetIntervalOperator *this,interval_t input)

{
  IOException *this_00;
  ulong uVar1;
  ParquetIntervalTargetType PVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar1 = input._0_8_;
  if ((((ulong)this & 0x8000000080000000) == 0) && (-1 < (long)uVar1)) {
    PVar2.bytes._8_4_ = (undefined4)(uVar1 / 1000);
    PVar2.bytes._0_8_ = this;
    return (ParquetIntervalTargetType)PVar2.bytes;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10,uVar1,input.micros);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Parquet files do not support negative intervals","");
  duckdb::IOException::IOException(this_00,(string *)local_40);
  __cxa_throw(this_00,&IOException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static TGT Operation(SRC input) {
		if (input.days < 0 || input.months < 0 || input.micros < 0) {
			throw IOException("Parquet files do not support negative intervals");
		}
		TGT result;
		Store<uint32_t>(input.months, result.bytes);
		Store<uint32_t>(input.days, result.bytes + sizeof(uint32_t));
		Store<uint32_t>(input.micros / 1000, result.bytes + sizeof(uint32_t) * 2);
		return result;
	}